

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Dam_ManCreateMultiRefs(Dam_Man_t *p,Vec_Int_t **pvRefsAnd,Vec_Int_t **pvRefsXor)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int *piVar2;
  int Addition;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  int v;
  long lVar4;
  
  p_00 = Vec_IntStart(p->pGia->nObjs * 2);
  p_01 = Vec_IntStart(p->pGia->nObjs);
  for (v = 0; v < p->pGia->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p->pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar1 = Dam_ObjHand(p,v);
      if (iVar1 != 0) {
        piVar2 = Dam_ObjSet(p,v);
        iVar1 = Gia_ObjIsXor(pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsAndReal(p->pGia,pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                          ,0x25a,
                          "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)");
          }
          uVar3 = extraout_RDX;
          for (lVar4 = 1; lVar4 <= *piVar2; lVar4 = lVar4 + 1) {
            Vec_IntAddToEntry(p_00,piVar2[lVar4],(int)uVar3);
            uVar3 = extraout_RDX_00;
          }
        }
        else {
          for (lVar4 = 1; lVar4 <= *piVar2; lVar4 = lVar4 + 1) {
            iVar1 = Abc_LitIsCompl(piVar2[lVar4]);
            if (iVar1 != 0) {
              __assert_fail("!Abc_LitIsCompl(pSet[k])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                            ,0x254,
                            "void Dam_ManCreateMultiRefs(Dam_Man_t *, Vec_Int_t **, Vec_Int_t **)");
            }
            iVar1 = Abc_Lit2Var(piVar2[lVar4]);
            Vec_IntAddToEntry(p_01,iVar1,Addition);
          }
        }
      }
    }
  }
  *pvRefsAnd = p_00;
  *pvRefsXor = p_01;
  return;
}

Assistant:

void Dam_ManCreateMultiRefs( Dam_Man_t * p, Vec_Int_t ** pvRefsAnd, Vec_Int_t ** pvRefsXor )  
{
    Vec_Int_t * vRefsAnd, * vRefsXor;
    Gia_Obj_t * pObj;
    int i, k, * pSet;
    vRefsAnd = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) );
    vRefsXor = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        if ( Gia_ObjIsXor(pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
            {
                assert( !Abc_LitIsCompl(pSet[k]) );
                Vec_IntAddToEntry( vRefsXor, Abc_Lit2Var(pSet[k]), 1 );
            }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
            for ( k = 1; k <= pSet[0]; k++ )
                Vec_IntAddToEntry( vRefsAnd, pSet[k], 1 );
        else assert( 0 );
    }
    *pvRefsAnd = vRefsAnd;
    *pvRefsXor = vRefsXor;
}